

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyusdz.cc
# Opt level: O3

bool tinyusdz::LoadUSDCFromMemory
               (uint8_t *addr,size_t length,string *filename,Stage *stage,string *warn,string *err,
               USDLoadOptions *options)

{
  Impl *pIVar1;
  size_type *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  int iVar4;
  char cVar5;
  bool bVar6;
  long *plVar7;
  undefined8 *puVar8;
  ulong *puVar9;
  size_t sVar10;
  ulong uVar11;
  pointer pNVar12;
  char cVar13;
  ulong uVar14;
  undefined8 uVar15;
  pointer pNVar16;
  ulong __val;
  USDCReader reader;
  StreamReader sr;
  string __str;
  string __str_1;
  string local_138;
  USDCReader local_118;
  long local_110;
  undefined1 local_108 [80];
  ulong *local_b8;
  uint local_b0;
  uint32_t uStack_ac;
  ulong local_a8 [2];
  pointer *local_98;
  uint local_90;
  undefined4 uStack_8c;
  pointer local_88 [2];
  undefined8 local_78;
  uint32_t uStack_70;
  uint32_t uStack_6c;
  undefined1 auStack_68 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (stage == (Stage *)0x0) {
    if (err == (string *)0x0) {
      return false;
    }
    ::std::__cxx11::string::_M_replace((ulong)err,0,(char *)err->_M_string_length,0x3fe3a0);
    return false;
  }
  iVar4 = options->max_memory_limit_in_mb;
  __val = (long)iVar4 << 0x14;
  if (length <= __val) {
    local_108._64_8_ = local_108._64_8_ & 0xffffffffffffff00;
    local_108._72_8_ = 0;
    local_78._4_4_ = 0x100;
    uStack_70 = 0x1000;
    uStack_6c = 0x1000;
    auStack_68._0_4_ = 0x4000000;
    auStack_68._4_4_ = 0x2000;
    auStack_68._8_8_ = (pointer)0x4000;
    auStack_68[0x10] = true;
    auStack_68[0x11] = true;
    local_78._0_4_ = options->num_threads;
    auStack_68[0x12] = options->strict_allowedToken_check;
    local_108._48_8_ = addr;
    local_108._56_8_ = length;
    usdc::USDCReader::USDCReader
              (&local_118,(StreamReader *)(local_108 + 0x30),(USDCReaderConfig *)&local_78);
    bVar6 = usdc::USDCReader::ReadUSDC(&local_118);
    if ((bVar6) && (bVar6 = usdc::USDCReader::ReconstructStage(&local_118,stage), bVar6)) {
      if (warn != (string *)0x0) {
        usdc::USDCReader::GetWarning_abi_cxx11_(&local_138,&local_118);
        ::std::__cxx11::string::operator=((string *)warn,(string *)&local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
      }
      bVar6 = true;
      if (err != (string *)0x0) {
        usdc::USDCReader::GetError_abi_cxx11_(&local_138,&local_118);
        ::std::__cxx11::string::operator=((string *)err,(string *)&local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
      }
    }
    else {
      if (warn != (string *)0x0) {
        usdc::USDCReader::GetWarning_abi_cxx11_(&local_138,&local_118);
        ::std::__cxx11::string::operator=((string *)warn,(string *)&local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
      }
      if (err != (string *)0x0) {
        usdc::USDCReader::GetError_abi_cxx11_(&local_138,&local_118);
        ::std::__cxx11::string::operator=((string *)err,(string *)&local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
      }
      bVar6 = false;
    }
    usdc::USDCReader::~USDCReader(&local_118);
    return bVar6;
  }
  if (err == (string *)0x0) {
    return false;
  }
  ::std::operator+(&local_50,"USDC data [",filename);
  plVar7 = (long *)::std::__cxx11::string::append((char *)&local_50);
  local_108._16_8_ = local_108 + 0x20;
  puVar9 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar9) {
    local_108._32_8_ = *puVar9;
    local_108._40_8_ = plVar7[3];
  }
  else {
    local_108._32_8_ = *puVar9;
    local_108._16_8_ = (ulong *)*plVar7;
  }
  local_108._24_8_ = plVar7[1];
  *plVar7 = (long)puVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  cVar13 = '\x01';
  if (9 < length) {
    sVar10 = length;
    cVar5 = '\x04';
    do {
      cVar13 = cVar5;
      if (sVar10 < 100) {
        cVar13 = cVar13 + -2;
        goto LAB_0012e17a;
      }
      if (sVar10 < 1000) {
        cVar13 = cVar13 + -1;
        goto LAB_0012e17a;
      }
      if (sVar10 < 10000) goto LAB_0012e17a;
      bVar6 = 99999 < sVar10;
      sVar10 = sVar10 / 10000;
      cVar5 = cVar13 + '\x04';
    } while (bVar6);
    cVar13 = cVar13 + '\x01';
  }
LAB_0012e17a:
  local_b8 = local_a8;
  ::std::__cxx11::string::_M_construct((ulong)&local_b8,cVar13);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_b8,local_b0,length);
  uVar11 = CONCAT44(uStack_ac,local_b0) + local_108._24_8_;
  uVar14 = 0xf;
  if ((undefined1 *)local_108._16_8_ != local_108 + 0x20) {
    uVar14 = local_108._32_8_;
  }
  if (uVar14 < uVar11) {
    uVar14 = 0xf;
    if (local_b8 != local_a8) {
      uVar14 = local_a8[0];
    }
    if (uVar14 < uVar11) goto LAB_0012e1fe;
    plVar7 = (long *)::std::__cxx11::string::replace
                               ((ulong)&local_b8,0,(char *)0x0,local_108._16_8_);
  }
  else {
LAB_0012e1fe:
    plVar7 = (long *)::std::__cxx11::string::_M_append(local_108 + 0x10,(ulong)local_b8);
  }
  local_118.impl_ = (Impl *)local_108;
  pIVar1 = (Impl *)(plVar7 + 2);
  if ((Impl *)*plVar7 == pIVar1) {
    local_108._0_8_ = pIVar1->crate_reader;
    local_108._8_8_ = plVar7[3];
  }
  else {
    local_108._0_8_ = pIVar1->crate_reader;
    local_118.impl_ = (Impl *)*plVar7;
  }
  local_110 = plVar7[1];
  *plVar7 = (long)pIVar1;
  plVar7[1] = 0;
  *(undefined1 *)&pIVar1->crate_reader = 0;
  plVar7 = (long *)::std::__cxx11::string::append((char *)&local_118);
  paVar3 = &local_138.field_2;
  puVar9 = (ulong *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar9) {
    local_138.field_2._M_allocated_capacity = *puVar9;
    local_138.field_2._8_8_ = plVar7[3];
    local_138._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_138.field_2._M_allocated_capacity = *puVar9;
    local_138._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_138._M_string_length = plVar7[1];
  *plVar7 = (long)puVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if (iVar4 == 0) {
    cVar13 = '\x01';
  }
  else {
    uVar11 = __val;
    cVar5 = '\x04';
    do {
      cVar13 = cVar5;
      if (uVar11 < 100) {
        cVar13 = cVar13 + -2;
        goto LAB_0012e30a;
      }
      if (uVar11 < 1000) {
        cVar13 = cVar13 + -1;
        goto LAB_0012e30a;
      }
      if (uVar11 < 10000) goto LAB_0012e30a;
      bVar6 = 99999 < uVar11;
      uVar11 = uVar11 / 10000;
      cVar5 = cVar13 + '\x04';
    } while (bVar6);
    cVar13 = cVar13 + '\x01';
  }
LAB_0012e30a:
  local_98 = local_88;
  ::std::__cxx11::string::_M_construct((ulong)&local_98,cVar13);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_98,local_90,__val);
  pNVar12 = (pointer)(CONCAT44(uStack_8c,local_90) + local_138._M_string_length);
  uVar15 = (pointer)0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != paVar3) {
    uVar15 = local_138.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar15 < pNVar12) {
    pNVar16 = (pointer)0xf;
    if (local_98 != local_88) {
      pNVar16 = local_88[0];
    }
    if (pNVar12 <= pNVar16) {
      puVar8 = (undefined8 *)
               ::std::__cxx11::string::replace
                         ((ulong)&local_98,0,(char *)0x0,(ulong)local_138._M_dataplus._M_p);
      goto LAB_0012e398;
    }
  }
  puVar8 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_138,(ulong)local_98);
LAB_0012e398:
  local_108._48_8_ = local_108 + 0x40;
  psVar2 = puVar8 + 2;
  if ((size_type *)*puVar8 == psVar2) {
    local_108._64_8_ = *psVar2;
    local_108._72_8_ = puVar8[3];
  }
  else {
    local_108._64_8_ = *psVar2;
    local_108._48_8_ = (size_type *)*puVar8;
  }
  local_108._56_8_ = puVar8[1];
  *puVar8 = psVar2;
  puVar8[1] = 0;
  *(undefined1 *)psVar2 = 0;
  plVar7 = (long *)::std::__cxx11::string::append(local_108 + 0x30);
  pNVar12 = (pointer)(plVar7 + 2);
  if ((pointer)*plVar7 == pNVar12) {
    auStack_68._8_8_ = plVar7[3];
    auStack_68._0_4_ = (undefined4)pNVar12->_parent;
    auStack_68._4_4_ = (undefined4)((ulong)pNVar12->_parent >> 0x20);
    local_78 = (pointer)auStack_68;
  }
  else {
    auStack_68._0_4_ = (undefined4)pNVar12->_parent;
    auStack_68._4_4_ = (undefined4)((ulong)pNVar12->_parent >> 0x20);
    local_78 = (pointer)*plVar7;
  }
  uStack_70 = (uint32_t)plVar7[1];
  uStack_6c = (uint32_t)((ulong)plVar7[1] >> 0x20);
  *plVar7 = (long)pNVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  ::std::__cxx11::string::_M_append((char *)err,(ulong)local_78);
  if (local_78 != (pointer)auStack_68) {
    operator_delete(local_78,CONCAT44(auStack_68._4_4_,auStack_68._0_4_) + 1);
  }
  if ((undefined1 *)local_108._48_8_ != local_108 + 0x40) {
    operator_delete((void *)local_108._48_8_,local_108._64_8_ + 1);
  }
  if (local_98 != local_88) {
    operator_delete(local_98,(ulong)((long)&local_88[0]->_parent + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != paVar3) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if (local_118.impl_ != (Impl *)local_108) {
    operator_delete(local_118.impl_,(ulong)((uint8_t *)local_108._0_8_ + 1));
  }
  if (local_b8 != local_a8) {
    operator_delete(local_b8,local_a8[0] + 1);
  }
  if ((undefined1 *)local_108._16_8_ != local_108 + 0x20) {
    operator_delete((void *)local_108._16_8_,local_108._32_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return false;
}

Assistant:

bool LoadUSDCFromMemory(const uint8_t *addr, const size_t length,
                        const std::string &filename, Stage *stage,
                        std::string *warn, std::string *err,
                        const USDLoadOptions &options) {
  if (stage == nullptr) {
    if (err) {
      (*err) = "null pointer for `stage` argument.\n";
    }
    return false;
  }

  bool swap_endian = false;  // @FIXME

  size_t max_length;

  // 32bit env
  if (sizeof(void *) == 4) {
    if (options.max_memory_limit_in_mb > 4096) {  // exceeds 4GB
      max_length = std::numeric_limits<uint32_t>::max();
    } else {
      max_length =
          size_t(1024) * size_t(1024) * size_t(options.max_memory_limit_in_mb);
    }
  } else {
    // TODO: Set hard limit?
    max_length =
        size_t(1024) * size_t(1024) * size_t(options.max_memory_limit_in_mb);
  }

  DCOUT("Max length = " << max_length);

  if (length > max_length) {
    if (err) {
      (*err) += "USDC data [" + filename +
                "] is too large(size = " + std::to_string(length) +
                ", which exceeds memory limit " + std::to_string(max_length) +
                ".\n";
    }

    return false;
  }

  StreamReader sr(addr, length, swap_endian);

  usdc::USDCReaderConfig config;
  config.numThreads = options.num_threads;
  config.strict_allowedToken_check = options.strict_allowedToken_check;
  usdc::USDCReader reader(&sr, config);

  if (!reader.ReadUSDC()) {
    if (warn) {
      (*warn) = reader.GetWarning();
    }

    if (err) {
      (*err) = reader.GetError();
    }
    return false;
  }

  DCOUT("Loaded USDC file.");

  // Reconstruct `Stage`(scene) object
  {
    if (!reader.ReconstructStage(stage)) {
      DCOUT("Failed to reconstruct Stage from Crate.");
      if (warn) {
        (*warn) = reader.GetWarning();
      }

      if (err) {
        (*err) = reader.GetError();
      }
      return false;
    }
  }

  if (warn) {
    (*warn) = reader.GetWarning();
  }

  // Reconstruct OK but may have some error.
  // TODO(syoyo): Return false in strict mode.
  if (err) {
    DCOUT(reader.GetError());
    (*err) = reader.GetError();
  }

  DCOUT("Reconstructed Stage from USDC file.");

  return true;
}